

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * monty_add(MontyContext *mc,mp_int *x,mp_int *y)

{
  mp_int *b;
  uint uVar1;
  mp_int *a;
  BignumCarry BVar2;
  BignumInt b_and;
  
  b = mc->m;
  a = mp_make_sized(b->nw);
  BVar2 = mp_add_masked_into(a->w,a->nw,x,y,0xffffffffffffffff,0,0);
  uVar1 = mp_cmp_hs(a,b);
  b_and = -(ulong)((uint)BVar2 | uVar1);
  mp_add_masked_into(a->w,a->nw,a,b,b_and,b_and,(ulong)((uint)b_and & 1));
  return a;
}

Assistant:

mp_int *monty_add(MontyContext *mc, mp_int *x, mp_int *y)
{
    return mp_modadd_in_range(x, y, mc->m);
}